

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O2

void __thiscall
CVmObjBigNum::encode_ber(CVmObjBigNum *this,char *buf,size_t buflen,size_t *outlen,int *ov)

{
  byte bVar1;
  char cVar2;
  CVmBigNumCacheReg *pCVar3;
  CVmBigNumCache *pCVar4;
  char *dst;
  long lVar5;
  long lVar7;
  uint thdl;
  ulong rem;
  uint local_3c;
  char local_38 [8];
  size_t sVar6;
  
  *ov = (byte)(this->super_CVmObject).ext_[4] & 1;
  *outlen = 0;
  dst = alloc_temp_reg((ulong)*(ushort *)(this->super_CVmObject).ext_,&local_3c);
  copy_val(dst,(this->super_CVmObject).ext_,0);
  while ((pCVar4 = S_bignum_cache, bVar1 = dst[4], (bVar1 & 8) == 0 && (*outlen < buflen))) {
    div_by_long(dst,0x80,(unsigned_long *)local_38);
    sVar6 = *outlen;
    *outlen = sVar6 + 1;
    buf[sVar6] = local_38[0];
  }
  pCVar3 = S_bignum_cache->reg_;
  pCVar3[local_3c].nxt_ = S_bignum_cache->free_reg_;
  pCVar4->free_reg_ = pCVar3 + local_3c;
  *ov = *ov | (uint)((bVar1 & 8) == 0);
  sVar6 = *outlen;
  if (sVar6 == 0) {
    *outlen = 1;
    *buf = '\0';
    sVar6 = *outlen;
  }
  lVar5 = (long)(int)sVar6;
  for (lVar7 = 0; lVar5 = lVar5 + -1, lVar7 < lVar5; lVar7 = lVar7 + 1) {
    cVar2 = buf[lVar7];
    buf[lVar7] = buf[lVar5];
    buf[lVar5] = cVar2;
  }
  for (lVar5 = 0; lVar5 < (int)*outlen + -1; lVar5 = lVar5 + 1) {
    buf[lVar5] = buf[lVar5] | 0x80;
  }
  return;
}

Assistant:

void CVmObjBigNum::encode_ber(char *buf, size_t buflen, size_t &outlen,
                              int &ov)
{
    /* BER can only store unsigned integers */
    ov = get_neg(ext_);

    /* clear the output buffer */
    outlen = 0;

    /* make a temporary copy of the value in a temp register */
    uint thdl;
    char *tmp = alloc_temp_reg(get_prec(ext_), &thdl);
    copy_val(tmp, ext_, FALSE);

    /* keep going until the number is zero or we run out of space */
    int z;
    while (!(z = is_zero(tmp)) && outlen < buflen)
    {
        /* get the low-order 7 bits by getting the remainder mod 128 */
        ulong rem;
        div_by_long(tmp, 128, &rem);
        
        /* store it */
        buf[outlen++] = (char)rem;
    }

    /* release the temporary register */
    release_temp_reg(thdl);

    /* if we ran out of buffer before we ran out of digits, we overflowed */
    ov |= (!z);

    /* if we wrote nothing, write a trivial zero value */
    if (outlen == 0)
        buf[outlen++] = 0;

    /* 
     *   We stored the bytes from least significant to most significant, but
     *   the standard format is the other way around.  Reverse the bytes.  
     */
    int i, j;
    for (i = 0, j = (int)outlen - 1 ; i < j ; ++i, --j)
    {
        char tmpc = buf[i];
        buf[i] = buf[j];
        buf[j] = tmpc;
    }

    /* set the high bit in every byte except the last one */
    for (i = 0 ; i < (int)outlen - 1 ; ++i)
        buf[i] |= 0x80;
}